

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGDefinePtr_conflict *
xmlRelaxNGGetElements(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def,int eora)

{
  xmlRelaxNGDefinePtr *ppxVar1;
  xmlRelaxNGDefinePtr_conflict *ppxVar2;
  xmlRelaxNGDefinePtr_conflict *ppxVar3;
  xmlRelaxNGDefinePtr pxVar4;
  xmlRelaxNGDefinePtr pxVar5;
  int iVar6;
  int iVar7;
  xmlRelaxNGDefinePtr pxVar8;
  
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0 || ctxt->nbErrors != 0) {
    return (xmlRelaxNGDefinePtr_conflict *)0x0;
  }
  iVar6 = 0;
  iVar7 = 0;
  ppxVar2 = (xmlRelaxNGDefinePtr_conflict *)0x0;
  pxVar4 = def;
LAB_001883d2:
  do {
    pxVar8 = pxVar4;
    if (eora == 2) {
      if (((uint)pxVar8->type < 9) &&
         ((0x1b8U >> (pxVar8->type & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) != 0))
      goto LAB_00188443;
LAB_00188414:
      if (((uint)(pxVar8->type + ~XML_RELAXNG_ATTRIBUTE) < 10) &&
         (pxVar4 = pxVar8->content, pxVar5 = pxVar4, pxVar4 != (xmlRelaxNGDefinePtr)0x0)) {
        do {
          pxVar5->parent = pxVar8;
          ppxVar1 = &pxVar5->next;
          pxVar5 = *ppxVar1;
        } while (*ppxVar1 != (xmlRelaxNGDefinePtr)0x0);
        goto LAB_001883d2;
      }
    }
    else {
      if (eora == 1) {
        if (pxVar8->type == XML_RELAXNG_ATTRIBUTE) goto LAB_00188443;
        goto LAB_00188414;
      }
      if ((eora != 0) || (1 < (uint)(pxVar8->type + ~XML_RELAXNG_EXCEPT))) goto LAB_00188414;
LAB_00188443:
      if (ppxVar2 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
        ppxVar2 = (xmlRelaxNGDefinePtr_conflict *)(*xmlMalloc)(0x58);
        if (ppxVar2 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
          xmlRngPErrMemory(ctxt);
          return (xmlRelaxNGDefinePtr_conflict *)0x0;
        }
        iVar6 = 10;
      }
      else if (iVar6 <= iVar7) {
        ppxVar3 = (xmlRelaxNGDefinePtr_conflict *)(*xmlRealloc)(ppxVar2,(long)(iVar6 * 2 + 1) << 3);
        if (ppxVar3 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
          xmlRngPErrMemory(ctxt);
          (*xmlFree)(ppxVar2);
          return (xmlRelaxNGDefinePtr_conflict *)0x0;
        }
        iVar6 = iVar6 * 2;
        ppxVar2 = ppxVar3;
      }
      ppxVar2[iVar7] = pxVar8;
      ppxVar2[(long)iVar7 + 1] = (xmlRelaxNGDefinePtr_conflict)0x0;
      iVar7 = iVar7 + 1;
    }
    do {
      if (pxVar8 == def) {
        return ppxVar2;
      }
      pxVar4 = pxVar8->next;
      if (pxVar4 != (xmlRelaxNGDefinePtr)0x0) goto LAB_001884f7;
      pxVar8 = pxVar8->parent;
    } while (pxVar8 != (xmlRelaxNGDefinePtr)0x0);
    pxVar4 = (xmlRelaxNGDefinePtr)0x0;
LAB_001884f7:
    if (pxVar4 == (xmlRelaxNGDefinePtr)0x0) {
      return ppxVar2;
    }
  } while( true );
}

Assistant:

static xmlRelaxNGDefinePtr *
xmlRelaxNGGetElements(xmlRelaxNGParserCtxtPtr ctxt,
                      xmlRelaxNGDefinePtr def, int eora)
{
    xmlRelaxNGDefinePtr *ret = NULL, parent, cur, tmp;
    int len = 0;
    int max = 0;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return (NULL);

    parent = NULL;
    cur = def;
    while (cur != NULL) {
        if (((eora == 0) && ((cur->type == XML_RELAXNG_ELEMENT) ||
                             (cur->type == XML_RELAXNG_TEXT))) ||
            ((eora == 1) && (cur->type == XML_RELAXNG_ATTRIBUTE)) ||
            ((eora == 2) && ((cur->type == XML_RELAXNG_DATATYPE) ||
	                     (cur->type == XML_RELAXNG_ELEMENT) ||
			     (cur->type == XML_RELAXNG_LIST) ||
                             (cur->type == XML_RELAXNG_TEXT) ||
			     (cur->type == XML_RELAXNG_VALUE)))) {
            if (ret == NULL) {
                max = 10;
                ret = (xmlRelaxNGDefinePtr *)
                    xmlMalloc((max + 1) * sizeof(xmlRelaxNGDefinePtr));
                if (ret == NULL) {
                    xmlRngPErrMemory(ctxt);
                    return (NULL);
                }
            } else if (max <= len) {
	        xmlRelaxNGDefinePtr *temp;

                max *= 2;
                temp = xmlRealloc(ret,
                               (max + 1) * sizeof(xmlRelaxNGDefinePtr));
                if (temp == NULL) {
                    xmlRngPErrMemory(ctxt);
		    xmlFree(ret);
                    return (NULL);
                }
		ret = temp;
            }
            ret[len++] = cur;
            ret[len] = NULL;
        } else if ((cur->type == XML_RELAXNG_CHOICE) ||
                   (cur->type == XML_RELAXNG_INTERLEAVE) ||
                   (cur->type == XML_RELAXNG_GROUP) ||
                   (cur->type == XML_RELAXNG_ONEORMORE) ||
                   (cur->type == XML_RELAXNG_ZEROORMORE) ||
                   (cur->type == XML_RELAXNG_OPTIONAL) ||
                   (cur->type == XML_RELAXNG_PARENTREF) ||
                   (cur->type == XML_RELAXNG_REF) ||
                   (cur->type == XML_RELAXNG_DEF) ||
		   (cur->type == XML_RELAXNG_EXTERNALREF)) {
            /*
             * Don't go within elements or attributes or string values.
             * Just gather the element top list
             */
            if (cur->content != NULL) {
                parent = cur;
                cur = cur->content;
                tmp = cur;
                while (tmp != NULL) {
                    tmp->parent = parent;
                    tmp = tmp->next;
                }
                continue;
            }
        }
        if (cur == def)
            break;
        if (cur->next != NULL) {
            cur = cur->next;
            continue;
        }
        do {
            cur = cur->parent;
            if (cur == NULL)
                break;
            if (cur == def)
                return (ret);
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
        } while (cur != NULL);
    }
    return (ret);
}